

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_mpi(uchar **p,uchar *start,mbedtls_mpi *X)

{
  int iVar1;
  int iVar2;
  size_t buflen;
  uchar *puVar3;
  
  buflen = mbedtls_mpi_size(X);
  iVar1 = -0x6c;
  if ((long)(int)buflen <= (long)*p - (long)start) {
    puVar3 = *p + -buflen;
    *p = puVar3;
    iVar1 = mbedtls_mpi_write_binary(X,puVar3,buflen);
    if (iVar1 == 0) {
      if ((X->s == 1) && (puVar3 = *p, (char)*puVar3 < '\0')) {
        if (puVar3 == start || (long)puVar3 - (long)start < 0) {
          return -0x6c;
        }
        *p = puVar3 + -1;
        puVar3[-1] = '\0';
        buflen = buflen + 1;
      }
      iVar2 = mbedtls_asn1_write_len(p,start,buflen);
      iVar1 = iVar2;
      if ((-1 < iVar2) &&
         (puVar3 = *p, iVar1 = -0x6c, puVar3 != start && -1 < (long)puVar3 - (long)start)) {
        *p = puVar3 + -1;
        puVar3[-1] = '\x02';
        iVar1 = (int)buflen + iVar2 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_write_mpi( unsigned char **p, unsigned char *start, const mbedtls_mpi *X )
{
    int ret;
    size_t len = 0;

    // Write the MPI
    //
    len = mbedtls_mpi_size( X );

    if( *p - start < (int) len )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    (*p) -= len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( X, *p, len ) );

    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if( X->s ==1 && **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_INTEGER ) );

    ret = (int) len;

cleanup:
    return( ret );
}